

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool picojson::_parse_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (value *out,
               input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  string *this;
  bool bVar1;
  int iVar2;
  value local_30;
  
  local_30.type_ = 4;
  local_30.field_1.string_ = (string *)operator_new(0x18);
  ((local_30.field_1.array_)->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_30.field_1.string_)->_M_string_length = 0;
  ((local_30.field_1.array_)->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value::operator=(out,&local_30);
  value::~value(&local_30);
  this = (out->field_1).string_;
  iVar2 = input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::expect(in,0x5d);
  bVar1 = true;
  if (iVar2 == 0) {
    do {
      local_30.type_ = 0;
      std::vector<picojson::value,_std::allocator<picojson::value>_>::emplace_back<picojson::value>
                ((vector<picojson::value,_std::allocator<picojson::value>_> *)this,&local_30);
      value::~value(&local_30);
      bVar1 = _parse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        ((pointer)this->_M_string_length + -1,in);
      if (!bVar1) {
        return false;
      }
      iVar2 = input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::expect(in,0x2c);
    } while (iVar2 != 0);
    iVar2 = input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::expect(in,0x5d);
    bVar1 = iVar2 != 0;
  }
  return bVar1;
}

Assistant:

inline bool _parse_array(value& out, input<Iter>& in) {
    out = value(array_type, false);
    array& a = out.get<array>();
    if (in.expect(']')) {
      return true;
    }
    do {
      a.push_back(value());
      if (! _parse(a.back(), in)) {
	return false;
      }
    } while (in.expect(','));
    return in.expect(']');
  }